

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

vec3 djb::operator*(mat3 *m,vec3 *r)

{
  float_t fVar1;
  float_t fVar2;
  vec3 vVar3;
  
  vVar3.x = dot(m->r,r);
  fVar1 = dot(m->r + 1,r);
  fVar2 = dot(m->r + 2,r);
  vVar3.y = fVar1;
  vVar3.z = fVar2;
  return vVar3;
}

Assistant:

vec3 operator*(const mat3 &m, const vec3 &r)
{
	return vec3(dot(m[0], r), dot(m[1], r), dot(m[2], r));
}